

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int rsa_rsassa_pkcs1_v15_encode
              (mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,size_t dst_len,uchar *dst)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info_00;
  uchar *puVar4;
  char *pcVar5;
  mbedtls_md_info_t *md_info;
  char *oid;
  uchar *p;
  size_t nb_pad;
  size_t oid_size;
  uchar *dst_local;
  size_t dst_len_local;
  uchar *hash_local;
  mbedtls_md_type_t local_10;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  
  nb_pad = 0;
  md_info = (mbedtls_md_info_t *)0x0;
  oid = (char *)dst;
  oid_size = (size_t)dst;
  dst_local = (uchar *)dst_len;
  dst_len_local = (size_t)hash;
  hash_local._4_4_ = hashlen;
  local_10 = md_alg;
  if (md_alg == MBEDTLS_MD_NONE) {
    if (dst_len < hashlen) {
      return -0x4080;
    }
    p = (uchar *)(dst_len - hashlen);
  }
  else {
    p = (uchar *)dst_len;
    md_info_00 = mbedtls_md_info_from_type(md_alg);
    if (md_info_00 == (mbedtls_md_info_t *)0x0) {
      return -0x4080;
    }
    iVar3 = mbedtls_oid_get_oid_by_md(local_10,(char **)&md_info,&nb_pad);
    if (iVar3 != 0) {
      return -0x4080;
    }
    bVar2 = mbedtls_md_get_size(md_info_00);
    hash_local._4_4_ = (uint)bVar2;
    if (((0x7f < (hash_local._4_4_ + 8) + nb_pad) || (hash_local._4_4_ + 10 < hash_local._4_4_)) ||
       ((hash_local._4_4_ + 10) + nb_pad < (ulong)(hash_local._4_4_ + 10))) {
      return -0x4080;
    }
    if (p < (uchar *)((hash_local._4_4_ + 10) + nb_pad)) {
      return -0x4080;
    }
    p = p + -((hash_local._4_4_ + 10) + nb_pad);
  }
  if (p < (uchar *)0xb) {
    hashlen_local = 0xffffbf80;
  }
  else {
    p = p + -3;
    pcVar5 = oid + 1;
    *oid = '\0';
    oid = oid + 2;
    *pcVar5 = '\x01';
    memset(oid,0xff,(size_t)p);
    puVar4 = p + (long)oid;
    oid = (char *)(puVar4 + 1);
    *puVar4 = '\0';
    if (local_10 == MBEDTLS_MD_NONE) {
      memcpy(oid,(void *)dst_len_local,(ulong)hash_local._4_4_);
      hashlen_local = 0;
    }
    else {
      *oid = '0';
      uVar1 = (uchar)nb_pad;
      puVar4[2] = uVar1 + '\b' + (char)hash_local._4_4_;
      puVar4[3] = '0';
      puVar4[4] = uVar1 + '\x04';
      puVar4[5] = '\x06';
      oid = (char *)(puVar4 + 7);
      puVar4[6] = uVar1;
      memcpy(oid,md_info,nb_pad);
      pcVar5 = oid + nb_pad;
      *pcVar5 = '\x05';
      pcVar5[1] = '\0';
      pcVar5[2] = '\x04';
      oid = pcVar5 + 4;
      pcVar5[3] = (char)hash_local._4_4_;
      memcpy(oid,(void *)dst_len_local,(ulong)hash_local._4_4_);
      oid = oid + hash_local._4_4_;
      if ((uchar *)oid == dst_local + oid_size) {
        hashlen_local = 0;
      }
      else {
        mbedtls_platform_zeroize((void *)oid_size,(size_t)dst_local);
        hashlen_local = 0xffffbf80;
      }
    }
  }
  return hashlen_local;
}

Assistant:

static int rsa_rsassa_pkcs1_v15_encode( mbedtls_md_type_t md_alg,
                                        unsigned int hashlen,
                                        const unsigned char *hash,
                                        size_t dst_len,
                                        unsigned char *dst )
{
    size_t oid_size  = 0;
    size_t nb_pad    = dst_len;
    unsigned char *p = dst;
    const char *oid  = NULL;

    /* Are we signing hashed or raw data? */
    if( md_alg != MBEDTLS_MD_NONE )
    {
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        if( mbedtls_oid_get_oid_by_md( md_alg, &oid, &oid_size ) != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );

        /* Double-check that 8 + hashlen + oid_size can be used as a
         * 1-byte ASN.1 length encoding and that there's no overflow. */
        if( 8 + hashlen + oid_size  >= 0x80         ||
            10 + hashlen            <  hashlen      ||
            10 + hashlen + oid_size <  10 + hashlen )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        /*
         * Static bounds check:
         * - Need 10 bytes for five tag-length pairs.
         *   (Insist on 1-byte length encodings to protect against variants of
         *    Bleichenbacher's forgery attack against lax PKCS#1v1.5 verification)
         * - Need hashlen bytes for hash
         * - Need oid_size bytes for hash alg OID.
         */
        if( nb_pad < 10 + hashlen + oid_size )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
        nb_pad -= 10 + hashlen + oid_size;
    }
    else
    {
        if( nb_pad < hashlen )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        nb_pad -= hashlen;
    }

    /* Need space for signature header and padding delimiter (3 bytes),
     * and 8 bytes for the minimal padding */
    if( nb_pad < 3 + 8 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    nb_pad -= 3;

    /* Now nb_pad is the amount of memory to be filled
     * with padding, and at least 8 bytes long. */

    /* Write signature header and padding */
    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset( p, 0xFF, nb_pad );
    p += nb_pad;
    *p++ = 0;

    /* Are we signing raw data? */
    if( md_alg == MBEDTLS_MD_NONE )
    {
        memcpy( p, hash, hashlen );
        return( 0 );
    }

    /* Signing hashed data, add corresponding ASN.1 structure
     *
     * DigestInfo ::= SEQUENCE {
     *   digestAlgorithm DigestAlgorithmIdentifier,
     *   digest Digest }
     * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
     * Digest ::= OCTET STRING
     *
     * Schematic:
     * TAG-SEQ + LEN [ TAG-SEQ + LEN [ TAG-OID  + LEN [ OID  ]
     *                                 TAG-NULL + LEN [ NULL ] ]
     *                 TAG-OCTET + LEN [ HASH ] ]
     */
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char)( 0x08 + oid_size + hashlen );
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char)( 0x04 + oid_size );
    *p++ = MBEDTLS_ASN1_OID;
    *p++ = (unsigned char) oid_size;
    memcpy( p, oid, oid_size );
    p += oid_size;
    *p++ = MBEDTLS_ASN1_NULL;
    *p++ = 0x00;
    *p++ = MBEDTLS_ASN1_OCTET_STRING;
    *p++ = (unsigned char) hashlen;
    memcpy( p, hash, hashlen );
    p += hashlen;

    /* Just a sanity-check, should be automatic
     * after the initial bounds check. */
    if( p != dst + dst_len )
    {
        mbedtls_platform_zeroize( dst, dst_len );
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }

    return( 0 );
}